

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> * __thiscall
hta::storage::file::Metric::get
          (vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *__return_storage_ptr__,
          Metric *this,TimePoint begin,TimePoint end,Duration interval,IntervalScope scope)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  HtaFile *this_00;
  rep rVar3;
  type tVar4;
  long *plVar5;
  size_type __n;
  reference __lhs;
  bool bVar6;
  TimeAggregate *ta;
  iterator __end2;
  iterator __begin2;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *__range2;
  base local_120;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_118;
  TimePoint t;
  __mbstate_t local_108;
  allocator<hta::TimeAggregate> local_fa;
  undefined1 local_f9;
  size_type local_f8;
  size_t count;
  int local_e4;
  duration<long,_std::ratio<1L,_1000000000L>_> local_e0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_d8;
  int local_cc;
  duration<long,_std::ratio<1L,_1000000000L>_> local_c8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_c0;
  int local_b4;
  duration<long,_std::ratio<1L,_1000000000L>_> local_b0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a8;
  long local_a0;
  int64_t index_end;
  int64_t index_begin;
  type offset_end;
  type offset_begin;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_78;
  TimePoint epoch_;
  Exception *e;
  HtaFile *file;
  long local_40;
  int64_t sz;
  Metric *this_local;
  IntervalScope scope_local;
  Duration interval_local;
  TimePoint end_local;
  TimePoint begin_local;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *result;
  
  sz = (int64_t)this;
  this_local = (Metric *)scope;
  scope_local = (IntervalScope)interval.__r;
  interval_local.__r =
       (rep)end.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r;
  end_local = begin;
  iVar2 = (*(this->super_Metric)._vptr_Metric[0xb])();
  local_40 = CONCAT44(extraout_var,iVar2);
  if (local_40 == 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::vector
              (__return_storage_ptr__);
  }
  else {
    this_00 = file_hta(this,(Duration)scope_local);
    bVar1 = std::chrono::operator>=
                      ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&interval_local,
                       &end_local.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      );
    bVar6 = true;
    if (!bVar1) {
      bVar6 = true;
      if ((int)this_local != 3) {
        bVar6 = this_local._4_4_ == 3;
      }
    }
    if (!bVar6) {
      __assert_fail("end >= begin || scope.begin == Scope::infinity || scope.end == Scope::infinity"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x17f,
                    "virtual std::vector<TimeAggregate> hta::storage::file::Metric::get(TimePoint, TimePoint, Duration, IntervalScope)"
                   );
    }
    local_78.__d.__r = (duration)epoch(this,(Duration)scope_local);
    offset_end.__r =
         (rep)std::chrono::operator-
                        (&end_local.
                          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         ,&local_78);
    index_begin = (int64_t)std::chrono::operator-
                                     ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)&interval_local,&local_78);
    index_end = -1;
    local_a0 = -1;
    switch((ulong)this_local & 0xffffffff) {
    case 0:
      rVar3 = Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                        (&offset_end);
      if (rVar3 < 0) {
        index_end = 0;
      }
      else {
        tVar4 = std::chrono::operator/
                          (&offset_end,(duration<long,_std::ratio<1L,_1000000000L>_> *)&scope_local)
        ;
        index_end = tVar4 + 1;
      }
      break;
    case 1:
      rVar3 = Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                        (&offset_end);
      if (rVar3 < 1) {
        index_end = 0;
      }
      else {
        local_b4 = 1;
        std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000000000l>> *)&local_b0,&local_b4);
        local_a8.__r = (rep)std::chrono::operator-(&offset_end,&local_b0);
        tVar4 = std::chrono::operator/
                          (&local_a8,(duration<long,_std::ratio<1L,_1000000000L>_> *)&scope_local);
        index_end = tVar4 + 1;
      }
      break;
    case 2:
      index_end = std::chrono::operator/
                            (&offset_end,
                             (duration<long,_std::ratio<1L,_1000000000L>_> *)&scope_local);
      break;
    case 3:
      index_end = 0;
    }
    switch((ulong)this_local >> 0x20) {
    case 0:
      rVar3 = Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)&index_begin);
      if (rVar3 < 1) {
        local_a0 = -1;
      }
      else {
        local_cc = 1;
        std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000000000l>> *)&local_c8,&local_cc);
        local_c0.__r = (rep)std::chrono::operator-
                                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&index_begin,
                                       &local_c8);
        local_a0 = std::chrono::operator/
                             (&local_c0,(duration<long,_std::ratio<1L,_1000000000L>_> *)&scope_local
                             );
      }
      break;
    case 1:
      rVar3 = Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)&index_begin);
      if (rVar3 < 0) {
        local_a0 = -1;
      }
      else {
        local_a0 = std::chrono::operator/
                             ((duration<long,_std::ratio<1L,_1000000000L>_> *)&index_begin,
                              (duration<long,_std::ratio<1L,_1000000000L>_> *)&scope_local);
      }
      break;
    case 2:
      rVar3 = Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)&index_begin);
      if (rVar3 < 1) {
        local_a0 = 0;
      }
      else {
        local_e4 = 1;
        std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000000000l>> *)&local_e0,&local_e4);
        local_d8.__r = (rep)std::chrono::operator-
                                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&index_begin,
                                       &local_e0);
        tVar4 = std::chrono::operator/
                          (&local_d8,(duration<long,_std::ratio<1L,_1000000000L>_> *)&scope_local);
        local_a0 = tVar4 + 1;
      }
      break;
    case 3:
      local_a0 = local_40 + -1;
    }
    count = 0;
    plVar5 = std::max<long>(&index_end,(long *)&count);
    index_end = *plVar5;
    plVar5 = std::min<long>(&local_a0,&local_40);
    local_a0 = *plVar5;
    if ((index_end < local_40) && (-1 < local_a0)) {
      if (index_end < 0) {
        __assert_fail("index_begin >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                      ,0x1d5,
                      "virtual std::vector<TimeAggregate> hta::storage::file::Metric::get(TimePoint, TimePoint, Duration, IntervalScope)"
                     );
      }
      if (local_40 <= index_end) {
        __assert_fail("index_begin < sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                      ,0x1d6,
                      "virtual std::vector<TimeAggregate> hta::storage::file::Metric::get(TimePoint, TimePoint, Duration, IntervalScope)"
                     );
      }
      if (local_a0 < 0) {
        __assert_fail("index_end >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                      ,0x1d7,
                      "virtual std::vector<TimeAggregate> hta::storage::file::Metric::get(TimePoint, TimePoint, Duration, IntervalScope)"
                     );
      }
      if (local_40 < local_a0) {
        __assert_fail("index_end <= sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                      ,0x1d8,
                      "virtual std::vector<TimeAggregate> hta::storage::file::Metric::get(TimePoint, TimePoint, Duration, IntervalScope)"
                     );
      }
      if (local_a0 < index_end) {
        memset(__return_storage_ptr__,0,0x18);
        std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::vector
                  (__return_storage_ptr__);
      }
      else {
        __n = (local_a0 - index_end) + 1;
        local_f9 = 0;
        local_f8 = __n;
        std::allocator<hta::TimeAggregate>::allocator(&local_fa);
        std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::vector
                  (__return_storage_ptr__,__n,&local_fa);
        std::allocator<hta::TimeAggregate>::~allocator(&local_fa);
        std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&t,index_end);
        File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::read
                  (this_00,(int)__return_storage_ptr__,
                   (void *)t.
                           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           .__d.__r,(size_t)local_108);
        __range2 = (vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)
                   std::chrono::operator*
                             (&index_end,
                              (duration<long,_std::ratio<1L,_1000000000L>_> *)&scope_local);
        local_120.__d.__r =
             (duration)
             std::chrono::operator+
                       (&local_78,(duration<long,_std::ratio<1L,_1000000000L>_> *)&__range2);
        Clock::time_point::time_point((time_point *)&local_118,&local_120);
        __end2 = std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::begin
                           (__return_storage_ptr__);
        ta = (TimeAggregate *)
             std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::end
                       (__return_storage_ptr__);
        while (bVar6 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
                                           *)&ta), bVar6) {
          __lhs = __gnu_cxx::
                  __normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
                  ::operator*(&__end2);
          bVar6 = std::chrono::operator==
                            ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)__lhs,&local_118);
          if (!bVar6) {
            __assert_fail("ta.time == t",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                          ,0x1ea,
                          "virtual std::vector<TimeAggregate> hta::storage::file::Metric::get(TimePoint, TimePoint, Duration, IntervalScope)"
                         );
          }
          std::chrono::
          time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::
          operator+=(&local_118,(duration *)&scope_local);
          __gnu_cxx::
          __normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
          ::operator++(&__end2);
        }
      }
    }
    else {
      memset(__return_storage_ptr__,0,0x18);
      std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::vector
                (__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TimeAggregate> Metric::get(TimePoint begin, TimePoint end, Duration interval,
                                       IntervalScope scope)
{
    auto sz = static_cast<int64_t>(size(interval));
    if (sz == 0)
    {
        return {};
    }

    HtaFile* file;
    try
    {
        file = &file_hta(interval);
    }
    catch (Exception& e)
    {
        if (e.error_number() == ENOENT)
        {
            // File does not exist... no data in this level
            // TODO handle this somehow better with meta or so
            return {};
        }
        throw;
    }

    assert(end >= begin || scope.begin == Scope::infinity || scope.end == Scope::infinity);

    auto epoch_ = epoch(interval);
    auto offset_begin = begin - epoch_;
    auto offset_end = end - epoch_;

    // We initialize so we don't get uninitialized warnings
    int64_t index_begin = -1;
    int64_t index_end = -1; // this point is **included** in the result!
    switch (scope.begin)
    {
    case Scope::closed:
        // Unfortunately division with negative numbers does *not* round down
        // so we have to make extra cases for pre-epoch
        if (offset_begin.count() <= 0)
        {
            index_begin = 0;
        }
        else
        {
            index_begin = (offset_begin - Duration(1)) / interval + 1;
        }
        break;
    case Scope::open:
        if (offset_begin.count() < 0)
        {
            index_begin = 0;
        }
        else
        {
            index_begin = offset_begin / interval + 1;
        }
        break;
    case Scope::extended:
        index_begin = offset_begin / interval;
        break;
    case Scope::infinity:
        index_begin = 0;
        break;
    }

    switch (scope.end)
    {
    case Scope::closed:
        if (offset_end.count() < 0)
        {
            index_end = -1;
        }
        else
        {
            index_end = offset_end / interval;
        }
        break;
    case Scope::open:
        if (offset_end.count() <= 0)
        {
            index_end = -1;
        }
        else
        {
            index_end = (offset_end - Duration(1)) / interval;
        }
        break;
    case Scope::extended:
        if (offset_end.count() <= 0)
        {
            index_end = 0;
        }
        else
        {
            index_end = (offset_end - Duration(1)) / interval + 1;
        }
        break;
    case Scope::infinity:
        index_end = sz - 1;
        break;
    }

    index_begin = std::max<int64_t>(index_begin, 0);
    index_end = std::min<int64_t>(index_end, sz);

    if (index_begin >= static_cast<int64_t>(sz) || index_end < 0)
    {
        return {};
    }

    assert(index_begin >= 0);
    assert(index_begin < sz);
    assert(index_end >= 0);
    assert(index_end <= sz);

    // It is possible that this happens in some strange configurations of scopes
    if (index_begin > index_end)
    {
        return {};
    }

    size_t count = index_end - index_begin + 1;

    std::vector<TimeAggregate> result(count);
    file->read(result, index_begin);

#ifndef NDEBUG
    // Check consistency of times
    TimePoint t = epoch_ + index_begin * interval;
    for (const auto& ta : result)
    {
        assert(ta.time == t);
        t += interval;
    }
#endif
    return result;
}